

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O1

void __thiscall duel::discardCard(duel *this,uint position,hand *hand__)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  
  uVar4 = (ulong)position;
  pcVar1 = (hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) * -0x5555555555555555;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    if (pcVar1[uVar4].cardType == 0) {
      hand__->regularCards = hand__->regularCards - 1;
      std::vector<card,_std::allocator<card>_>::_M_erase(&hand__->hand_,pcVar1 + uVar4);
      return;
    }
    hand__->specialCards = hand__->specialCards - 1;
    std::vector<card,_std::allocator<card>_>::_M_erase(&hand__->hand_,pcVar1 + uVar4);
    return;
  }
  pcVar6 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
  while( true ) {
    lVar5 = *(long *)(pcVar6 + 0x40);
    if (lVar5 == *(long *)(pcVar6 + 0x20)) {
      *pcVar6 = '\x01';
      return;
    }
    if (lVar5 == *(long *)(pcVar6 + 0x48)) {
      lVar5 = *(long *)(*(long *)(pcVar6 + 0x58) + -8) + 0x1e0;
    }
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)(pcVar6 + 0x68),(card *)(lVar5 + -0x30));
    std::deque<card,_std::allocator<card>_>::pop_back
              ((deque<card,_std::allocator<card>_> *)(pcVar6 + 0x10));
    lVar5 = *(long *)(pcVar6 + 0x40);
    *(int *)(pcVar6 + 0x60) = *(int *)(pcVar6 + 0x60) + *(int *)(*(long *)(pcVar6 + 0x70) + -0x28);
    if (lVar5 == *(long *)(pcVar6 + 0x48)) {
      lVar5 = *(long *)(*(long *)(pcVar6 + 0x58) + -8) + 0x1e0;
    }
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)(pcVar6 + 0x88),(card *)(lVar5 + -0x30));
    std::deque<card,_std::allocator<card>_>::pop_back
              ((deque<card,_std::allocator<card>_> *)(pcVar6 + 0x10));
    iVar2 = *(int *)(*(long *)(pcVar6 + 0x90) + -0x28) + *(int *)(pcVar6 + 0x80);
    *(int *)(pcVar6 + 0x80) = iVar2;
    if (*(int *)(pcVar6 + 0x60) != iVar2) break;
    ((field *)(pcVar6 + 0x60))->pile = 0;
    ((field *)(pcVar6 + 0x80))->pile = 0;
    field::clearField((field *)(pcVar6 + 0x60));
    field::clearField((field *)(pcVar6 + 0x80));
  }
  return;
}

Assistant:

void duel::discardCard(unsigned int position, hand& hand__) {
    if (isRegularCard(hand__.hand_.at(position))) hand__.setRegularCards(hand__.getRegularCards()-1);
    else hand__.setSpecialCards(hand__.getSpecialCards()-1);
    hand__.hand_.erase(hand__.hand_.begin() + position);
}